

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestConsole::Run(SubprocessTestConsole *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  ExitStatus EVar4;
  Subprocess *pSVar5;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestConsole *this_local;
  
  subproc = (Subprocess *)this;
  iVar3 = isatty(0);
  if (iVar3 != 0) {
    iVar3 = isatty(1);
    if (iVar3 != 0) {
      iVar3 = isatty(2);
      if (iVar3 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"test -t 0 -a -t 1 -a -t 2",&local_39);
        pSVar5 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,true);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
        local_18 = pSVar5;
        bVar2 = testing::Test::Check
                          (g_current_test,pSVar5 != (Subprocess *)0x0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                           ,0xbb,"(Subprocess*)0 != subproc");
        if (bVar2) {
          SubprocessSet::ResetTokenAvailable(&(this->super_SubprocessTest).subprocs_);
          while( true ) {
            bVar2 = Subprocess::Done(local_18);
            pTVar1 = g_current_test;
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_,(TokenPool *)0x0);
          }
          bVar2 = SubprocessSet::IsTokenAvailable(&(this->super_SubprocessTest).subprocs_);
          bVar2 = testing::Test::Check
                            (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                             ,0xc1,"subprocs_.IsTokenAvailable()");
          pTVar1 = g_current_test;
          if (bVar2) {
            EVar4 = Subprocess::Finish(local_18);
            testing::Test::Check
                      (pTVar1,EVar4 == ExitSuccess,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0xc3,"ExitSuccess == subproc->Finish()");
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, Console) {
  // Skip test if we don't have the console ourselves.
  if (isatty(0) && isatty(1) && isatty(2)) {
    Subprocess* subproc =
        subprocs_.Add("test -t 0 -a -t 1 -a -t 2", /*use_console=*/true);
    ASSERT_NE((Subprocess*)0, subproc);

    subprocs_.ResetTokenAvailable();
    while (!subproc->Done()) {
      subprocs_.DoWork(NULL);
    }
    ASSERT_FALSE(subprocs_.IsTokenAvailable());

    EXPECT_EQ(ExitSuccess, subproc->Finish());
  }
}